

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_1::IDivFastPath
               (Duration num,Duration den,int64_t *q,Duration *rem)

{
  bool bVar1;
  uint32_t lo;
  uint32_t uVar2;
  int64_t iVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Duration DVar4;
  Duration d;
  Duration d_00;
  Duration d_01;
  HiRep local_208;
  uint32_t local_200;
  long local_1e8;
  int64_t rem_sec;
  int64_t quotient;
  uint32_t local_1d0;
  HiRep local_1b8;
  uint32_t local_1b0;
  HiRep local_198;
  uint32_t local_190;
  HiRep local_178;
  uint32_t local_170;
  HiRep local_158;
  uint32_t local_150;
  HiRep local_138;
  uint32_t local_130;
  uint32_t den_lo;
  int64_t den_hi;
  uint32_t num_lo;
  long local_98;
  int64_t num_hi;
  Duration *rem_local;
  int64_t *q_local;
  Duration den_local;
  Duration num_local;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  
  DVar4.rep_hi_.lo_ = num.rep_lo_;
  bVar1 = time_internal::IsInfiniteDuration(num);
  if ((!bVar1) && (bVar1 = time_internal::IsInfiniteDuration(den), !bVar1)) {
    DVar4.rep_hi_.hi_ = 0;
    DVar4.rep_lo_ = (uint32_t)extraout_RDX;
    local_98 = time_internal::GetRepHi((time_internal *)num.rep_hi_,DVar4);
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = DVar4.rep_hi_.lo_;
    d.rep_lo_ = (uint32_t)extraout_RDX_00;
    lo = time_internal::GetRepLo((time_internal *)num.rep_hi_,d);
    d_00.rep_hi_.hi_ = 0;
    d_00.rep_hi_.lo_ = den.rep_lo_;
    d_00.rep_lo_ = (uint32_t)extraout_RDX_01;
    iVar3 = time_internal::GetRepHi((time_internal *)den.rep_hi_,d_00);
    d_01.rep_hi_.hi_ = 0;
    d_01.rep_hi_.lo_ = den.rep_lo_;
    d_01.rep_lo_ = (uint32_t)extraout_RDX_02;
    uVar2 = time_internal::GetRepLo((time_internal *)den.rep_hi_,d_01);
    if (iVar3 == 0) {
      if (uVar2 == 4) {
        if ((-1 < local_98) && (local_98 < 0x225c17d00)) {
          *q = local_98 * 1000000000 + (ulong)(lo >> 2);
          DVar4 = time_internal::MakeDuration(0,lo % 4);
          local_138 = DVar4.rep_hi_;
          local_130 = DVar4.rep_lo_;
          rem->rep_hi_ = local_138;
          rem->rep_lo_ = local_130;
          return true;
        }
      }
      else if (uVar2 == 400) {
        if ((-1 < local_98) && (local_98 < 0xd6bf94d455)) {
          *q = local_98 * 10000000 + (ulong)lo / 400;
          DVar4 = time_internal::MakeDuration(0,lo % 400);
          local_158 = DVar4.rep_hi_;
          local_150 = DVar4.rep_lo_;
          rem->rep_hi_ = local_158;
          rem->rep_lo_ = local_150;
          return true;
        }
      }
      else if (uVar2 == 4000) {
        if ((-1 < local_98) && (local_98 < 0x8637bd04b56)) {
          *q = local_98 * 1000000 + (ulong)lo / 4000;
          DVar4 = time_internal::MakeDuration(0,lo % 4000);
          local_178 = DVar4.rep_hi_;
          local_170 = DVar4.rep_lo_;
          rem->rep_hi_ = local_178;
          rem->rep_lo_ = local_170;
          return true;
        }
      }
      else if (((uVar2 == 4000000) && (-1 < local_98)) && (local_98 < 0x20c49ba5a64af7)) {
        *q = local_98 * 1000 + (ulong)lo / 4000000;
        DVar4 = time_internal::MakeDuration(0,lo % 4000000);
        local_198 = DVar4.rep_hi_;
        local_190 = DVar4.rep_lo_;
        rem->rep_hi_ = local_198;
        rem->rep_lo_ = local_190;
        return true;
      }
    }
    else if ((0 < iVar3) && (uVar2 == 0)) {
      if (local_98 < 0) {
        if (lo != 0) {
          local_98 = local_98 + 1;
        }
        rem_sec = local_98 / iVar3;
        local_1e8 = local_98 % iVar3;
        if (0 < local_1e8) {
          local_1e8 = local_1e8 - iVar3;
          rem_sec = rem_sec + 1;
        }
        if (lo != 0) {
          local_1e8 = local_1e8 + -1;
        }
        *q = rem_sec;
        DVar4 = time_internal::MakeDuration(local_1e8,lo);
        local_208 = DVar4.rep_hi_;
        local_200 = DVar4.rep_lo_;
        rem->rep_hi_ = local_208;
        rem->rep_lo_ = local_200;
        return true;
      }
      if (iVar3 != 1) {
        *q = local_98 / iVar3;
        DVar4 = time_internal::MakeDuration(local_98 % iVar3,lo);
        quotient = (int64_t)DVar4.rep_hi_;
        local_1d0 = DVar4.rep_lo_;
        (rem->rep_hi_).lo_ = (undefined4)quotient;
        (rem->rep_hi_).hi_ = quotient._4_4_;
        rem->rep_lo_ = local_1d0;
        return true;
      }
      *q = local_98;
      DVar4 = time_internal::MakeDuration(0,lo);
      local_1b8 = DVar4.rep_hi_;
      local_1b0 = DVar4.rep_lo_;
      rem->rep_hi_ = local_1b8;
      rem->rep_lo_ = local_1b0;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool IDivFastPath(const Duration num, const Duration den, int64_t* q,
                         Duration* rem) {
  // Bail if num or den is an infinity.
  if (time_internal::IsInfiniteDuration(num) ||
      time_internal::IsInfiniteDuration(den))
    return false;

  int64_t num_hi = time_internal::GetRepHi(num);
  uint32_t num_lo = time_internal::GetRepLo(num);
  int64_t den_hi = time_internal::GetRepHi(den);
  uint32_t den_lo = time_internal::GetRepLo(den);

  if (den_hi == 0) {
    if (den_lo == kTicksPerNanosecond) {
      // Dividing by 1ns
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000000000) {
        *q = num_hi * 1000000000 + num_lo / kTicksPerNanosecond;
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 100 * kTicksPerNanosecond) {
      // Dividing by 100ns (common when converting to Universal time)
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 10000000) {
        *q = num_hi * 10000000 + num_lo / (100 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 1000 * kTicksPerNanosecond) {
      // Dividing by 1us
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000000) {
        *q = num_hi * 1000000 + num_lo / (1000 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 1000000 * kTicksPerNanosecond) {
      // Dividing by 1ms
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000) {
        *q = num_hi * 1000 + num_lo / (1000000 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    }
  } else if (den_hi > 0 && den_lo == 0) {
    // Dividing by positive multiple of 1s
    if (num_hi >= 0) {
      if (den_hi == 1) {
        *q = num_hi;
        *rem = time_internal::MakeDuration(0, num_lo);
        return true;
      }
      *q = num_hi / den_hi;
      *rem = time_internal::MakeDuration(num_hi % den_hi, num_lo);
      return true;
    }
    if (num_lo != 0) {
      num_hi += 1;
    }
    int64_t quotient = num_hi / den_hi;
    int64_t rem_sec = num_hi % den_hi;
    if (rem_sec > 0) {
      rem_sec -= den_hi;
      quotient += 1;
    }
    if (num_lo != 0) {
      rem_sec -= 1;
    }
    *q = quotient;
    *rem = time_internal::MakeDuration(rem_sec, num_lo);
    return true;
  }

  return false;
}